

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

block * gen_ecode(compiler_state_t *cstate,u_char *eaddr,qual q)

{
  int iVar1;
  block *pbVar2;
  block *tmp;
  block *b;
  u_char *eaddr_local;
  compiler_state_t *cstate_local;
  block *pbStack_10;
  qual q_local;
  
  cstate_local._4_1_ = q.addr;
  if (((cstate_local._4_1_ != '\x01') && (cstate_local._4_1_ != '\0')) ||
     (cstate_local._5_1_ = q.proto, cstate_local._5_1_ != '\x01')) {
LAB_00111868:
    bpf_error(cstate,"ethernet address used in non-ether expression");
    return (block *)0x0;
  }
  iVar1 = cstate->linktype;
  cstate_local._6_1_ = q.dir;
  if (iVar1 == 1) {
LAB_001117b5:
    pbVar2 = gen_prevlinkhdr_check(cstate);
    pbStack_10 = gen_ehostop(cstate,eaddr,(uint)cstate_local._6_1_);
    if (pbVar2 != (block *)0x0) {
      gen_and(pbVar2,pbStack_10);
    }
  }
  else {
    if (iVar1 == 6) {
      pbVar2 = gen_thostop(cstate,eaddr,(uint)cstate_local._6_1_);
      return pbVar2;
    }
    if (iVar1 == 10) {
      pbVar2 = gen_fhostop(cstate,eaddr,(uint)cstate_local._6_1_);
      return pbVar2;
    }
    if ((iVar1 != 0x69) && (iVar1 != 0x77)) {
      if (iVar1 == 0x7a) {
        pbVar2 = gen_ipfchostop(cstate,eaddr,(uint)cstate_local._6_1_);
        return pbVar2;
      }
      if (((iVar1 != 0x7f) && (iVar1 != 0xa3)) && (iVar1 != 0xc0)) {
        if (iVar1 != 0xf0 && iVar1 != 0xf1) {
          bpf_error(cstate,
                    "ethernet addresses supported only on ethernet/FDDI/token ring/802.11/ATM LANE/Fibre Channel"
                   );
          goto LAB_00111868;
        }
        goto LAB_001117b5;
      }
    }
    pbStack_10 = gen_wlanhostop(cstate,eaddr,(uint)cstate_local._6_1_);
  }
  return pbStack_10;
}

Assistant:

struct block *
gen_ecode(compiler_state_t *cstate, const u_char *eaddr, struct qual q)
{
	struct block *b, *tmp;

	if ((q.addr == Q_HOST || q.addr == Q_DEFAULT) && q.proto == Q_LINK) {
		switch (cstate->linktype) {
		case DLT_EN10MB:
		case DLT_NETANALYZER:
		case DLT_NETANALYZER_TRANSPARENT:
			tmp = gen_prevlinkhdr_check(cstate);
			b = gen_ehostop(cstate, eaddr, (int)q.dir);
			if (tmp != NULL)
				gen_and(tmp, b);
			return b;
		case DLT_FDDI:
			return gen_fhostop(cstate, eaddr, (int)q.dir);
		case DLT_IEEE802:
			return gen_thostop(cstate, eaddr, (int)q.dir);
		case DLT_IEEE802_11:
		case DLT_PRISM_HEADER:
		case DLT_IEEE802_11_RADIO_AVS:
		case DLT_IEEE802_11_RADIO:
		case DLT_PPI:
			return gen_wlanhostop(cstate, eaddr, (int)q.dir);
		case DLT_IP_OVER_FC:
			return gen_ipfchostop(cstate, eaddr, (int)q.dir);
		default:
			bpf_error(cstate, "ethernet addresses supported only on ethernet/FDDI/token ring/802.11/ATM LANE/Fibre Channel");
			break;
		}
	}
	bpf_error(cstate, "ethernet address used in non-ether expression");
	/* NOTREACHED */
	return NULL;
}